

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

bool __thiscall Moc::until(Moc *this,Token target)

{
  Symbol *pSVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  Token *pTVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  Token TVar12;
  long lVar13;
  
  pSVar1 = (this->super_Parser).symbols.d.ptr;
  lVar4 = (this->super_Parser).index;
  iVar8 = 0;
  if (lVar4 == 0) {
    iVar9 = 0;
    iVar10 = 0;
    iVar5 = 0;
  }
  else {
    uVar11 = pSVar1[lVar4 + -1].token - LANGLE;
    iVar9 = 0;
    iVar10 = 0;
    iVar5 = 0;
    iVar8 = 0;
    if (uVar11 < 8) {
      uVar6 = (ulong)uVar11;
      iVar8 = *(int *)(&DAT_0017b238 + uVar6 * 4);
      iVar9 = *(int *)(&DAT_0017b258 + uVar6 * 4);
      iVar10 = *(int *)(&DAT_0017b278 + uVar6 * 4);
      iVar5 = *(int *)(&DAT_0017b298 + uVar6 * 4);
    }
  }
  lVar2 = (this->super_Parser).symbols.d.size;
  pTVar7 = &pSVar1[lVar4].token;
  lVar13 = -1;
  do {
    if (lVar2 <= lVar4) break;
    (this->super_Parser).index = lVar4 + 1;
    TVar12 = *pTVar7;
    switch(TVar12) {
    case LANGLE:
      TVar12 = LANGLE;
      if (iVar10 == 0 && iVar8 == 0) {
        iVar5 = iVar5 + 1;
LAB_001229c6:
        iVar8 = 0;
        iVar10 = 0;
      }
      break;
    case PP_RANGLE:
      TVar12 = PP_RANGLE;
      if (iVar10 == 0 && iVar8 == 0) {
        iVar5 = iVar5 + -1;
        goto LAB_001229c6;
      }
      break;
    case LPAREN:
      iVar10 = iVar10 + 1;
      TVar12 = LPAREN;
      break;
    case PP_RPAREN:
      iVar10 = iVar10 + -1;
      TVar12 = PP_RPAREN;
      break;
    case ELIPSIS:
      break;
    case LBRACK:
      iVar9 = iVar9 + 1;
      TVar12 = LBRACK;
      break;
    case RBRACK:
      iVar9 = iVar9 + -1;
      TVar12 = RBRACK;
      break;
    case LBRACE:
      iVar8 = iVar8 + 1;
      TVar12 = LBRACE;
      break;
    case RBRACE:
      iVar8 = iVar8 + -1;
      TVar12 = RBRACE;
      break;
    default:
      if ((TVar12 == GTGT) && (TVar12 = GTGT, iVar10 == 0 && iVar8 == 0)) {
        iVar5 = iVar5 + -2;
        TVar12 = PP_RANGLE;
        goto LAB_001229c6;
      }
    }
    if ((((TVar12 == target) && (iVar8 < 1)) && (iVar9 < 1)) && (iVar10 < 1)) {
      if ((target != PP_RANGLE) || (iVar5 < 1)) {
        if (target != COMMA) {
          return true;
        }
        lVar13 = lVar4 + 1;
        if (iVar5 < 1) {
          return true;
        }
        goto LAB_00122a1a;
      }
    }
    else {
LAB_00122a1a:
      if (((target == COMMA) && (TVar12 == EQ)) && (lVar13 != -1)) goto LAB_00122a87;
    }
    if ((((iVar8 < 0) || (iVar9 < 0)) || (iVar10 < 0)) || (target == PP_RANGLE && iVar5 < 0)) {
      (this->super_Parser).index = lVar4;
      break;
    }
    pTVar7 = pTVar7 + 0xc;
    lVar4 = lVar4 + 1;
  } while ((0 < iVar8) || (TVar12 != SEMIC));
  bVar3 = false;
  if ((target == COMMA) && ((bVar3 = false, iVar5 != 0 && (bVar3 = false, lVar13 != -1)))) {
LAB_00122a87:
    (this->super_Parser).index = lVar13;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Moc::until(Token target) {
    int braceCount = 0;
    int brackCount = 0;
    int parenCount = 0;
    int angleCount = 0;
    if (index) {
        switch(symbols.at(index-1).token) {
        case LBRACE: ++braceCount; break;
        case LBRACK: ++brackCount; break;
        case LPAREN: ++parenCount; break;
        case LANGLE: ++angleCount; break;
        default: break;
        }
    }

    //when searching commas within the default argument, we should take care of template depth (anglecount)
    // unfortunately, we do not have enough semantic information to know if '<' is the operator< or
    // the beginning of a template type. so we just use heuristics.
    qsizetype possible = -1;

    while (index < symbols.size()) {
        Token t = symbols.at(index++).token;
        switch (t) {
        case LBRACE: ++braceCount; break;
        case RBRACE: --braceCount; break;
        case LBRACK: ++brackCount; break;
        case RBRACK: --brackCount; break;
        case LPAREN: ++parenCount; break;
        case RPAREN: --parenCount; break;
        case LANGLE:
            if (parenCount == 0 && braceCount == 0)
                ++angleCount;
          break;
        case RANGLE:
            if (parenCount == 0 && braceCount == 0)
                --angleCount;
          break;
        case GTGT:
            if (parenCount == 0 && braceCount == 0) {
                angleCount -= 2;
                t = RANGLE;
            }
            break;
        default: break;
        }
        if (t == target
            && braceCount <= 0
            && brackCount <= 0
            && parenCount <= 0
            && (target != RANGLE || angleCount <= 0)) {
            if (target != COMMA || angleCount <= 0)
                return true;
            possible = index;
        }

        if (target == COMMA && t == EQ && possible != -1) {
            index = possible;
            return true;
        }

        if (braceCount < 0 || brackCount < 0 || parenCount < 0
            || (target == RANGLE && angleCount < 0)) {
            --index;
            break;
        }

        if (braceCount <= 0 && t == SEMIC) {
            // Abort on semicolon. Allow recovering bad template parsing (QTBUG-31218)
            break;
        }
    }

    if (target == COMMA && angleCount != 0 && possible != -1) {
        index = possible;
        return true;
    }

    return false;
}